

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opencv_demo.cc
# Opt level: O2

int main(int argc,char **argv)

{
  apriltag_detection_t *paVar1;
  char cVar2;
  int iVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  char *__s1;
  undefined8 uVar6;
  undefined4 *puVar7;
  zarray_t *za;
  ostream *poVar8;
  char *this;
  long lVar9;
  double dVar10;
  String text;
  undefined8 local_368;
  Size textsize;
  undefined8 local_358;
  undefined8 local_350;
  undefined8 local_348;
  undefined8 local_340;
  undefined8 local_338;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 local_320;
  apriltag_detection_t *det;
  int baseline;
  undefined4 local_308 [2];
  Mat *local_300;
  undefined8 local_2f8;
  image_u8_t im;
  Matx<double,_4,_1> local_2c8;
  VideoCapture cap;
  Mat gray;
  stringstream ss;
  undefined4 uStack_214;
  undefined8 local_208;
  undefined8 uStack_200;
  Mat frame;
  
  uVar5 = getopt_create();
  getopt_add_bool(uVar5,0x68,"help",0,"Show this help");
  getopt_add_bool(uVar5,100,"debug",1,"Enable debugging output (slow)");
  getopt_add_bool(uVar5,0x71,"quiet",0,"Reduce output");
  getopt_add_string(uVar5,0x66,"family","tag36h11","Tag family to use");
  getopt_add_int(uVar5,0x74,"threads","1","Use this many CPU threads");
  getopt_add_double(uVar5,0x78,"decimate","1.0","Decimate input image by this factor");
  getopt_add_double(uVar5,0x62,"blur","0.0","Apply low-pass blur to input");
  this = "Spend more time trying to align edges of tags";
  getopt_add_bool(uVar5,0x30,"refine-edges",1);
  iVar3 = getopt_parse(uVar5,argc,argv);
  if (iVar3 != 0) {
    iVar3 = getopt_get_bool(uVar5);
    if (iVar3 == 0) {
      cv::VideoCapture::VideoCapture(&cap,0,0);
      cVar2 = cv::VideoCapture::isOpened();
      if (cVar2 == '\0') {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Couldn\'t open video capture device");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar3 = -1;
      }
      else {
        __s1 = (char *)getopt_get_string(uVar5,"family");
        iVar3 = strcmp(__s1,"tag36h11");
        if (iVar3 == 0) {
          uVar6 = tag36h11_create();
        }
        else {
          iVar3 = strcmp(__s1,"tag25h9");
          if (iVar3 == 0) {
            uVar6 = tag25h9_create();
          }
          else {
            iVar3 = strcmp(__s1,"tag16h5");
            if (iVar3 == 0) {
              uVar6 = tag16h5_create();
            }
            else {
              iVar3 = strcmp(__s1,"tagCircle21h7");
              if (iVar3 == 0) {
                uVar6 = tagCircle21h7_create();
              }
              else {
                iVar3 = strcmp(__s1,"tagCircle49h12");
                if (iVar3 == 0) {
                  uVar6 = tagCircle49h12_create();
                }
                else {
                  iVar3 = strcmp(__s1,"tagStandard41h12");
                  if (iVar3 == 0) {
                    uVar6 = tagStandard41h12_create();
                  }
                  else {
                    iVar3 = strcmp(__s1,"tagStandard52h13");
                    if (iVar3 != 0) {
                      puts("Unrecognized tag family name. Use e.g. \"tag36h11\".");
                      exit(-1);
                    }
                    uVar6 = tagStandard52h13_create();
                  }
                }
              }
            }
          }
        }
        puVar7 = (undefined4 *)apriltag_detector_create();
        apriltag_detector_add_family_bits(puVar7,uVar6,2);
        dVar10 = (double)getopt_get_double(uVar5,"decimate");
        puVar7[1] = (float)dVar10;
        dVar10 = (double)getopt_get_double(uVar5,"blur");
        puVar7[2] = (float)dVar10;
        uVar4 = getopt_get_int(uVar5,"threads");
        *puVar7 = uVar4;
        uVar4 = getopt_get_bool(uVar5,"debug");
        puVar7[6] = uVar4;
        uVar4 = getopt_get_bool(uVar5,"refine-edges");
        puVar7[3] = uVar4;
        cv::Mat::Mat(&frame);
        cv::Mat::Mat(&gray);
        do {
          cv::VideoCapture::operator>>(&cap,&frame);
          local_208 = 0;
          text.field_2._M_allocated_capacity = 0;
          _ss = CONCAT44(uStack_214,0x1010000);
          text._M_dataplus._M_p._0_4_ = 0x2010000;
          text._M_string_length = (size_type)&gray;
          cv::cvtColor((cv *)&ss,(_InputArray *)&text,(_OutputArray *)0x6,0,(int)this);
          za = (zarray_t *)apriltag_detector_detect(puVar7,&im);
          iVar3 = zarray_size(za);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
          poVar8 = std::operator<<(poVar8," tags detected");
          std::endl<char,std::char_traits<char>>(poVar8);
          lVar9 = 0;
          while( true ) {
            iVar3 = zarray_size(za);
            if (iVar3 <= lVar9) break;
            if (za == (zarray_t *)0x0) {
              __assert_fail("za != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/./common/zarray.h"
                            ,0xc5,"void zarray_get(const zarray_t *, int, void *)");
            }
            if (za->size <= lVar9) {
              __assert_fail("idx < za->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/./common/zarray.h"
                            ,200,"void zarray_get(const zarray_t *, int, void *)");
            }
            memcpy(&det,za->data + za->el_sz * lVar9,za->el_sz);
            paVar1 = det;
            text.field_2._M_allocated_capacity = 0;
            text._M_dataplus._M_p._0_4_ = 0x3010000;
            local_320 = CONCAT44((int)det->p[0][1],(int)det->p[0][0]);
            local_328 = CONCAT44((int)det->p[1][1],(int)det->p[1][0]);
            text._M_string_length = (size_type)&frame;
            cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&ss);
            _ss = 0;
            local_208 = 0;
            uStack_200 = 0;
            cv::line(&text,&local_320,&local_328,&ss,2,8,0);
            text.field_2._M_allocated_capacity = 0;
            text._M_dataplus._M_p._0_4_ = 0x3010000;
            local_330 = CONCAT44((int)paVar1->p[0][1],(int)paVar1->p[0][0]);
            local_338 = CONCAT44((int)paVar1->p[3][1],(int)paVar1->p[3][0]);
            text._M_string_length = (size_type)&frame;
            cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&ss);
            _ss = 0;
            local_208 = 0x406fe00000000000;
            uStack_200 = 0;
            cv::line(&text,&local_330,&local_338,&ss,2,8,0);
            text.field_2._M_allocated_capacity = 0;
            text._M_dataplus._M_p._0_4_ = 0x3010000;
            local_340 = CONCAT44((int)paVar1->p[1][1],(int)paVar1->p[1][0]);
            local_348 = CONCAT44((int)paVar1->p[2][1],(int)paVar1->p[2][0]);
            text._M_string_length = (size_type)&frame;
            cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&ss);
            _ss = 0x406fe00000000000;
            local_208 = 0;
            uStack_200 = 0;
            cv::line(&text,&local_340,&local_348,&ss,2,8,0);
            text.field_2._M_allocated_capacity = 0;
            text._M_dataplus._M_p._0_4_ = 0x3010000;
            local_350 = CONCAT44((int)paVar1->p[2][1],(int)paVar1->p[2][0]);
            local_358 = CONCAT44((int)paVar1->p[3][1],(int)paVar1->p[3][0]);
            text._M_string_length = (size_type)&frame;
            cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&ss);
            _ss = 0x406fe00000000000;
            local_208 = 0;
            uStack_200 = 0;
            cv::line(&text,&local_350,&local_358,&ss,2,8,0);
            std::__cxx11::stringstream::stringstream((stringstream *)&ss);
            std::ostream::operator<<((ostream *)&local_208,paVar1->id);
            std::__cxx11::stringbuf::str();
            cv::getTextSize((string *)&textsize,(int)&text,1.0,6,(int *)0x2);
            local_2f8 = 0;
            local_308[0] = 0x3010000;
            local_368 = CONCAT44((int)(paVar1->c[1] + (double)(textsize.height / 2)),
                                 (int)(paVar1->c[0] - (double)(textsize.width / 2)));
            this = (char *)&local_2c8;
            local_300 = &frame;
            cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)this);
            local_2c8.val[0] = 255.0;
            local_2c8.val[1] = 153.0;
            local_2c8.val[2] = 0.0;
            local_2c8.val[3] = 0.0;
            cv::putText(0x3ff0000000000000,local_308,&text,&local_368,6,this,2,8,0);
            std::__cxx11::string::~string((string *)&text);
            std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
            lVar9 = lVar9 + 1;
          }
          if (za != (zarray_t *)0x0) {
            free(za->data);
            free(za);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"Tag Detections",(allocator<char> *)local_308);
          text.field_2._M_allocated_capacity = 0;
          text._M_dataplus._M_p._0_4_ = 0x1010000;
          text._M_string_length = (size_type)&frame;
          cv::imshow((string *)&ss,(_InputArray *)&text);
          std::__cxx11::string::~string((string *)&ss);
          iVar3 = cv::waitKey(0x1e);
        } while (iVar3 < 0);
        apriltag_detector_destroy(puVar7);
        iVar3 = strcmp(__s1,"tag36h11");
        if (iVar3 == 0) {
          tag36h11_destroy(uVar6);
        }
        else {
          iVar3 = strcmp(__s1,"tag25h9");
          if (iVar3 == 0) {
            tag25h9_destroy(uVar6);
          }
          else {
            iVar3 = strcmp(__s1,"tag16h5");
            if (iVar3 == 0) {
              tag16h5_destroy(uVar6);
            }
            else {
              iVar3 = strcmp(__s1,"tagCircle21h7");
              if (iVar3 == 0) {
                tagCircle21h7_destroy(uVar6);
              }
              else {
                iVar3 = strcmp(__s1,"tagCircle49h12");
                if (iVar3 == 0) {
                  tagCircle49h12_destroy(uVar6);
                }
                else {
                  iVar3 = strcmp(__s1,"tagStandard41h12");
                  if (iVar3 == 0) {
                    tagStandard41h12_destroy(uVar6);
                  }
                  else {
                    iVar3 = strcmp(__s1,"tagStandard52h13");
                    if (iVar3 == 0) {
                      tagStandard52h13_destroy(uVar6);
                    }
                  }
                }
              }
            }
          }
        }
        getopt_destroy(uVar5);
        cv::Mat::~Mat(&gray);
        cv::Mat::~Mat(&frame);
        iVar3 = 0;
      }
      cv::VideoCapture::~VideoCapture(&cap);
      return iVar3;
    }
  }
  printf("Usage: %s [options]\n",*argv);
  getopt_do_usage();
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{
    getopt_t *getopt = getopt_create();

    getopt_add_bool(getopt, 'h', "help", 0, "Show this help");
    getopt_add_bool(getopt, 'd', "debug", 1, "Enable debugging output (slow)");
    getopt_add_bool(getopt, 'q', "quiet", 0, "Reduce output");
    getopt_add_string(getopt, 'f', "family", "tag36h11", "Tag family to use");
    getopt_add_int(getopt, 't', "threads", "1", "Use this many CPU threads");
    getopt_add_double(getopt, 'x', "decimate", "1.0", "Decimate input image by this factor");
    getopt_add_double(getopt, 'b', "blur", "0.0", "Apply low-pass blur to input");
    getopt_add_bool(getopt, '0', "refine-edges", 1, "Spend more time trying to align edges of tags");

    if (!getopt_parse(getopt, argc, argv, 1) ||
            getopt_get_bool(getopt, "help")) {
        printf("Usage: %s [options]\n", argv[0]);
        getopt_do_usage(getopt);
        exit(0);
    }

    // Initialize camera
    VideoCapture cap(0);
    if (!cap.isOpened()) {
        cerr << "Couldn't open video capture device" << endl;
        return -1;
    }

    // Initialize tag detector with options
    apriltag_family_t *tf = NULL;
    const char *famname = getopt_get_string(getopt, "family");
    if (!strcmp(famname, "tag36h11")) {
        tf = tag36h11_create();
    } else if (!strcmp(famname, "tag25h9")) {
        tf = tag25h9_create();
    } else if (!strcmp(famname, "tag16h5")) {
        tf = tag16h5_create();
    } else if (!strcmp(famname, "tagCircle21h7")) {
        tf = tagCircle21h7_create();
    } else if (!strcmp(famname, "tagCircle49h12")) {
        tf = tagCircle49h12_create();
    } else if (!strcmp(famname, "tagStandard41h12")) {
        tf = tagStandard41h12_create();
    } else if (!strcmp(famname, "tagStandard52h13")) {
        tf = tagStandard52h13_create();
    } else {
        printf("Unrecognized tag family name. Use e.g. \"tag36h11\".\n");
        exit(-1);
    }


    apriltag_detector_t *td = apriltag_detector_create();
    apriltag_detector_add_family(td, tf);
    td->quad_decimate = getopt_get_double(getopt, "decimate");
    td->quad_sigma = getopt_get_double(getopt, "blur");
    td->nthreads = getopt_get_int(getopt, "threads");
    td->debug = getopt_get_bool(getopt, "debug");
    td->refine_edges = getopt_get_bool(getopt, "refine-edges");

    Mat frame, gray;
    while (true) {
        cap >> frame;
        cvtColor(frame, gray, COLOR_BGR2GRAY);

        // Make an image_u8_t header for the Mat data
        image_u8_t im = { .width = gray.cols,
            .height = gray.rows,
            .stride = gray.cols,
            .buf = gray.data
        };

        zarray_t *detections = apriltag_detector_detect(td, &im);
        cout << zarray_size(detections) << " tags detected" << endl;

        // Draw detection outlines
        for (int i = 0; i < zarray_size(detections); i++) {
            apriltag_detection_t *det;
            zarray_get(detections, i, &det);
            line(frame, Point(det->p[0][0], det->p[0][1]),
                     Point(det->p[1][0], det->p[1][1]),
                     Scalar(0, 0xff, 0), 2);
            line(frame, Point(det->p[0][0], det->p[0][1]),
                     Point(det->p[3][0], det->p[3][1]),
                     Scalar(0, 0, 0xff), 2);
            line(frame, Point(det->p[1][0], det->p[1][1]),
                     Point(det->p[2][0], det->p[2][1]),
                     Scalar(0xff, 0, 0), 2);
            line(frame, Point(det->p[2][0], det->p[2][1]),
                     Point(det->p[3][0], det->p[3][1]),
                     Scalar(0xff, 0, 0), 2);

            stringstream ss;
            ss << det->id;
            String text = ss.str();
            int fontface = FONT_HERSHEY_SCRIPT_SIMPLEX;
            double fontscale = 1.0;
            int baseline;
            Size textsize = getTextSize(text, fontface, fontscale, 2,
                                            &baseline);
            putText(frame, text, Point(det->c[0]-textsize.width/2,
                                       det->c[1]+textsize.height/2),
                    fontface, fontscale, Scalar(0xff, 0x99, 0), 2);
        }
        zarray_destroy(detections);

        imshow("Tag Detections", frame);
        if (waitKey(30) >= 0)
            break;
    }

    apriltag_detector_destroy(td);

    if (!strcmp(famname, "tag36h11")) {
        tag36h11_destroy(tf);
    } else if (!strcmp(famname, "tag25h9")) {
        tag25h9_destroy(tf);
    } else if (!strcmp(famname, "tag16h5")) {
        tag16h5_destroy(tf);
    } else if (!strcmp(famname, "tagCircle21h7")) {
        tagCircle21h7_destroy(tf);
    } else if (!strcmp(famname, "tagCircle49h12")) {
        tagCircle49h12_destroy(tf);
    } else if (!strcmp(famname, "tagStandard41h12")) {
        tagStandard41h12_destroy(tf);
    } else if (!strcmp(famname, "tagStandard52h13")) {
        tagStandard52h13_destroy(tf);
    }


    getopt_destroy(getopt);

    return 0;
}